

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpm.cpp
# Opt level: O2

bool ReadCPM(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  string *path;
  Data *data;
  FILE *__stream;
  allocator<char> local_89;
  undefined1 local_88 [36];
  Format fmt;
  
  Format::Format(&fmt,ProDos);
  iVar2 = MemFile::size(file);
  iVar3 = Format::disk_size(&fmt);
  if (iVar2 == iVar3) {
    path = MemFile::name_abi_cxx11_(file);
    __stream = (FILE *)local_88;
    std::__cxx11::string::string<std::allocator<char>>((string *)__stream,"cpm",&local_89);
    bVar1 = IsFileExt(path,(string *)__stream);
    std::__cxx11::string::~string((string *)local_88);
    if (bVar1) {
      MemFile::rewind(file,__stream);
      this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(this,&fmt,data,false);
      std::__cxx11::string::assign
                ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          strType);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadCPM(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt = RegularFormat::ProDos;

    // 720K images with a .cpm extension use the SAM Coupe Pro-Dos parameters
    if (file.size() != fmt.disk_size() || !IsFileExt(file.name(), "cpm"))
        return false;

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "Pro-DOS";

    return true;
}